

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::doSetObjectName(QObject *this,QString *name)

{
  bool bVar1;
  QObjectPrivate *rhs;
  QString *in_RSI;
  QObjectPrivate *d;
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  *in_stack_00000078;
  
  rhs = d_func((QObject *)0x3ed4ec);
  QObjectPrivate::ensureExtraData(d);
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
              *)d);
  QPropertyData<QString>::valueBypassingBindings
            (&(rhs->extraData->objectName).super_QPropertyData<QString>);
  bVar1 = ::operator!=(in_RSI,(QString *)rhs);
  if (bVar1) {
    QPropertyData<QString>::setValueBypassingBindings
              ((QPropertyData<QString> *)in_RSI,(parameter_type)rhs);
    QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
    ::notify(in_stack_00000078);
  }
  return;
}

Assistant:

void QObject::doSetObjectName(const QString &name)
{
    Q_D(QObject);

    d->ensureExtraData();

    d->extraData->objectName.removeBindingUnlessInWrapper();

    if (d->extraData->objectName.valueBypassingBindings() != name) {
        d->extraData->objectName.setValueBypassingBindings(name);
        d->extraData->objectName.notify(); // also emits a signal
    }
}